

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O2

void get_max_sizes(Am_Value_List *components,int *max_width,int *max_height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object item;
  
  *max_width = 0;
  *max_height = 0;
  item.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(components);
  while( true ) {
    bVar1 = Am_Value_List::Last(components);
    if (bVar1) break;
    pAVar4 = Am_Value_List::Get(components);
    Am_Object::operator=(&item,pAVar4);
    pAVar4 = Am_Object::Get(&item,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
    if (bVar1) {
      pAVar4 = Am_Object::Get(&item,0x66,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(&item,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (*max_width < iVar2) {
        *max_width = iVar2;
      }
      if (*max_height < iVar3) {
        *max_height = iVar3;
      }
    }
    Am_Value_List::Next(components);
  }
  Am_Object::~Am_Object(&item);
  return;
}

Assistant:

void
get_max_sizes(Am_Value_List &components, int &max_width, int &max_height)
{
  max_width = 0;
  max_height = 0;
  Am_Object item;
  for (components.Start(); !components.Last(); components.Next()) {
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int width = item.Get(Am_WIDTH);
      int height = item.Get(Am_HEIGHT);
      if (width > max_width)
        max_width = width;
      if (height > max_height)
        max_height = height;
    }
  }
}